

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O0

void __thiscall
QSharedDataPointer<QCommandLineOptionPrivate>::detach_helper
          (QSharedDataPointer<QCommandLineOptionPrivate> *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  QCommandLineOptionPrivate *this_00;
  int in_ECX;
  void *in_RDX;
  __fn *in_RSI;
  QSharedDataPointer<QCommandLineOptionPrivate> *in_RDI;
  void *in_R8;
  QCommandLineOptionPrivate *x;
  
  iVar2 = clone(in_RDI,in_RSI,in_RDX,in_ECX,in_R8);
  QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1f8c6b);
  Qt::totally_ordered_wrapper<QCommandLineOptionPrivate_*>::get(&in_RDI->d);
  bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1f8c7d);
  if ((!bVar1) &&
     (this_00 = Qt::totally_ordered_wrapper<QCommandLineOptionPrivate_*>::get(&in_RDI->d),
     this_00 != (QCommandLineOptionPrivate *)0x0)) {
    QCommandLineOptionPrivate::~QCommandLineOptionPrivate(this_00);
    operator_delete(this_00,0x70);
  }
  Qt::totally_ordered_wrapper<QCommandLineOptionPrivate_*>::reset
            (&in_RDI->d,(QCommandLineOptionPrivate *)CONCAT44(extraout_var,iVar2));
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QSharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d.get()->ref.deref())
        delete d.get();
    d.reset(x);
}